

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Type __thiscall wabt::Func::GetLocalType(Func *this,Index index)

{
  Type TVar1;
  pointer ppVar2;
  uint uVar3;
  Index i;
  
  uVar3 = (uint)((ulong)((long)(this->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  i = index - uVar3;
  if (index < uVar3) {
    return (Type)(this->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start[index].enum_;
  }
  uVar3 = 0;
  for (ppVar2 = (this->local_types).decls_.
                super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != (this->local_types).decls_.
                super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    uVar3 = uVar3 + ppVar2->second;
  }
  if (i < uVar3) {
    TVar1 = LocalTypes::operator[](&this->local_types,i);
    return (Type)TVar1.enum_;
  }
  __assert_fail("index < local_types.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.cc",
                0xd4,"Type wabt::Func::GetLocalType(Index) const");
}

Assistant:

Type Func::GetLocalType(Index index) const {
  Index num_params = decl.GetNumParams();
  if (index < num_params) {
    return GetParamType(index);
  } else {
    index -= num_params;
    assert(index < local_types.size());
    return local_types[index];
  }
}